

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O1

REF_STATUS ref_subdiv_mark_prism_sides(REF_SUBDIV ref_subdiv)

{
  REF_CELL pRVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  pRVar1 = ref_subdiv->grid->cell[10];
  if (0 < pRVar1->max) {
    iVar3 = 0;
    do {
      if (pRVar1->c2n[(long)pRVar1->size_per * (long)iVar3] != -1) {
        lVar5 = 0;
        do {
          lVar4 = (long)pRVar1->size_per * (long)iVar3;
          uVar2 = ref_subdiv_mark_to_split
                            (ref_subdiv,
                             pRVar1->c2n
                             [pRVar1->e2n[(long)*(int *)((long)&DAT_00237b58 + lVar5) * 2] + lVar4],
                             pRVar1->c2n
                             [(long)(int)lVar4 +
                              (long)pRVar1->e2n[*(int *)((long)&DAT_00237b58 + lVar5) * 2 + 1]]);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,0x121,"ref_subdiv_mark_prism_sides",(ulong)uVar2,"sd");
            return uVar2;
          }
          lVar5 = lVar5 + 4;
        } while (lVar5 != 0xc);
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 < pRVar1->max);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_subdiv_mark_prism_sides(REF_SUBDIV ref_subdiv) {
  REF_CELL ref_cell = ref_grid_pri(ref_subdiv_grid(ref_subdiv));
  REF_INT cell, cell_edge;
  REF_INT node0, node1;

  REF_INT pri_side_edge;
  REF_INT pri_side_cell_edge[] = {2, 4, 5};

  each_ref_cell_valid_cell(ref_cell, cell) {
    for (pri_side_edge = 0; pri_side_edge < 3; pri_side_edge++) {
      cell_edge = pri_side_cell_edge[pri_side_edge];
      node0 = ref_cell_e2n(ref_cell, 0, cell_edge, cell);
      node1 = ref_cell_e2n(ref_cell, 1, cell_edge, cell);
      RSS(ref_subdiv_mark_to_split(ref_subdiv, node0, node1), "sd");
    }
  }

  return REF_SUCCESS;
}